

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_s256_30_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  mzd_addmul_v_s256_30_256_idx(c,A,v->w64[2] >> 0x22);
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  mzd_addmul_v_s256_30_256_idx(c, A, CONST_BLOCK(v, 0)->w64[2] >> 34);
}